

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.hpp
# Opt level: O0

uint8_t * __thiscall NodeBTree::parseData(NodeBTree *this,KeyType *key,uint8_t *data)

{
  byte bVar1;
  bool bVar2;
  uint32_t size;
  uint64_t uVar3;
  uint8_t *in_RDX;
  NodeKey *in_RSI;
  long in_RDI;
  uint32_t sectorIndex;
  uint32_t volumeIndex;
  uint32_t size2;
  uint32_t size1;
  uint32_t nodeIndex;
  uchar flags;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  uint8_t *local_18;
  NodeKey *local_10;
  
  local_18 = in_RDX;
  local_10 = in_RSI;
  bVar1 = readNext<unsigned_char,unsigned_char>
                    ((uchar **)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
  NodeKey::setFlags(local_10,(uint)bVar1);
  uVar3 = decodeBitsAndAdvance(&local_18);
  NodeKey::setNodeIndex(local_10,(uint32_t)uVar3);
  uVar3 = decodeBitsAndAdvance(&local_18);
  size = (uint32_t)uVar3;
  NodeKey::setSize1(local_10,size);
  bVar2 = NodeKey::hasBits0123(local_10);
  if (bVar2) {
    uVar3 = decodeBitsAndAdvance(&local_18);
    size = (uint32_t)uVar3;
  }
  NodeKey::setSize2(local_10,size);
  if ((*(byte *)(in_RDI + 8) & 1) == 0) {
    NodeKey::setVolumeIndex(local_10,0);
  }
  else {
    uVar3 = decodeBitsAndAdvance(&local_18);
    NodeKey::setVolumeIndex(local_10,(uint32_t)uVar3);
  }
  uVar3 = decodeBitsAndAdvance(&local_18);
  NodeKey::setSectorIndex(local_10,(uint32_t)uVar3);
  return local_18;
}

Assistant:

const uint8_t* parseData(KeyType& key, const uint8_t* data) const
	{
		const auto flags = readNext<uint8_t>(data);
		key.setFlags(flags);
		
		const auto nodeIndex = static_cast<uint32_t>(decodeBitsAndAdvance(data));
		key.setNodeIndex(nodeIndex);

		const auto size1 = static_cast<uint32_t>(decodeBitsAndAdvance(data));
		key.setSize1(size1);
		
		// TODO: figure out
		const auto size2 = key.hasBits0123() ? static_cast<uint32_t>(decodeBitsAndAdvance(data)) : size1;
		key.setSize2(size2);
		
		if (m_hasMultipleVolumes) {
			const auto volumeIndex = static_cast<uint32_t>(decodeBitsAndAdvance(data));
			key.setVolumeIndex(volumeIndex);
		} else {
			key.setVolumeIndex(0);
		}
		
		const auto sectorIndex = static_cast<uint32_t>(decodeBitsAndAdvance(data));
		key.setSectorIndex(sectorIndex);
		
		return data;
	}